

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::ClearTxInSignData(Psbt *this,uint32_t index)

{
  long lVar1;
  undefined8 *puVar2;
  wally_map_item *sig;
  size_t idx_1;
  wally_map_item *keypath;
  size_t idx;
  wally_psbt_input *input;
  wally_psbt *psbt_pointer;
  uint32_t index_local;
  Psbt *this_local;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xb19,"ClearTxInSignData");
  lVar1 = *(long *)((long)this->wally_psbt_pointer_ + 0x10) + (ulong)index * 0x110;
  if (*(long *)(lVar1 + 0x10) != 0) {
    memset(*(void **)(lVar1 + 0x10),0,*(size_t *)(lVar1 + 0x18));
    FreeWallyBuffer(*(void **)(lVar1 + 0x10));
    *(undefined8 *)(lVar1 + 0x18) = 0;
    *(undefined8 *)(lVar1 + 0x10) = 0;
  }
  if (*(long *)(lVar1 + 0x20) != 0) {
    memset(*(void **)(lVar1 + 0x20),0,*(size_t *)(lVar1 + 0x28));
    FreeWallyBuffer(*(void **)(lVar1 + 0x20));
    *(undefined8 *)(lVar1 + 0x28) = 0;
    *(undefined8 *)(lVar1 + 0x20) = 0;
  }
  for (keypath = (wally_map_item *)0x0; keypath < *(wally_map_item **)(lVar1 + 0x50);
      keypath = (wally_map_item *)((long)&keypath->key + 1)) {
    puVar2 = (undefined8 *)(*(long *)(lVar1 + 0x48) + (long)keypath * 0x20);
    memset((void *)*puVar2,0,puVar2[1]);
    memset((void *)puVar2[2],0,puVar2[3]);
    FreeWallyBuffer((void *)*puVar2);
    FreeWallyBuffer((void *)puVar2[2]);
    memset(puVar2,0,0x20);
  }
  *(undefined8 *)(lVar1 + 0x50) = 0;
  for (sig = (wally_map_item *)0x0; sig < *(wally_map_item **)(lVar1 + 0x68);
      sig = (wally_map_item *)((long)&sig->key + 1)) {
    puVar2 = (undefined8 *)(*(long *)(lVar1 + 0x60) + (long)sig * 0x20);
    memset((void *)*puVar2,0,puVar2[1]);
    memset((void *)puVar2[2],0,puVar2[3]);
    FreeWallyBuffer((void *)*puVar2);
    FreeWallyBuffer((void *)puVar2[2]);
    memset(puVar2,0,0x20);
  }
  *(undefined8 *)(lVar1 + 0x68) = 0;
  *(undefined4 *)(lVar1 + 0x90) = 0;
  return;
}

Assistant:

void Psbt::ClearTxInSignData(uint32_t index) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  struct wally_psbt_input *input = &psbt_pointer->inputs[index];

  if (input->redeem_script != nullptr) {
    memset(input->redeem_script, 0, input->redeem_script_len);
    FreeWallyBuffer(input->redeem_script);
    input->redeem_script_len = 0;
    input->redeem_script = nullptr;
  }
  if (input->witness_script != nullptr) {
    memset(input->witness_script, 0, input->witness_script_len);
    FreeWallyBuffer(input->witness_script);
    input->witness_script_len = 0;
    input->witness_script = nullptr;
  }
  for (size_t idx = 0; idx < input->keypaths.num_items; ++idx) {
    auto keypath = &input->keypaths.items[idx];
    memset(keypath->key, 0, keypath->key_len);
    memset(keypath->value, 0, keypath->value_len);
    FreeWallyBuffer(keypath->key);
    FreeWallyBuffer(keypath->value);
    memset(keypath, 0, sizeof(*keypath));
  }
  input->keypaths.num_items = 0;
  for (size_t idx = 0; idx < input->signatures.num_items; ++idx) {
    auto sig = &input->signatures.items[idx];
    memset(sig->key, 0, sig->key_len);
    memset(sig->value, 0, sig->value_len);
    FreeWallyBuffer(sig->key);
    FreeWallyBuffer(sig->value);
    memset(sig, 0, sizeof(*sig));
  }
  input->signatures.num_items = 0;
  input->sighash = 0;
}